

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

int AF_AActor_Spawn(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret
                   ,int numret)

{
  VMValue *pVVar1;
  AActor *val;
  PClassActor *pPVar2;
  PClassActor *type;
  char *pcVar3;
  int iVar4;
  DVector3 local_40;
  
  if (numparam < 1) {
    pcVar3 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      type = (PClassActor *)(param->field_0).field_1.a;
      if (type == (PClassActor *)0x0) {
        NullParam("\"type\"");
        type = (PClassActor *)(param->field_0).field_1.a;
      }
      if ((type != (PClassActor *)0x0) &&
         (pPVar2 = type, type != (PClassActor *)AActor::RegistrationInfo.MyClass)) {
        do {
          pPVar2 = (PClassActor *)(pPVar2->super_PClass).ParentClass;
          if (pPVar2 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
        } while (pPVar2 != (PClassActor *)0x0);
        if (pPVar2 == (PClassActor *)0x0) {
          pcVar3 = "type == NULL || type->IsDescendantOf(RUNTIME_CLASS(AActor))";
          goto LAB_0042ecaa;
        }
      }
      if (numparam == 1) {
        pVVar1 = defaultparam->Array;
        if (defaultparam->Array[1].field_0.field_3.Type != '\x01') {
          pcVar3 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_0042ec2e:
          __assert_fail(pcVar3,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x1247,
                        "int AF_AActor_Spawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
        }
      }
      else {
        pVVar1 = param;
        if (param[1].field_0.field_3.Type != '\x01') {
          pcVar3 = "(param[paramnum]).Type == REGT_FLOAT";
          goto LAB_0042ec2e;
        }
      }
      local_40.X = (double)pVVar1[1].field_0.field_1.a;
      if (numparam < 3) {
        pVVar1 = defaultparam->Array;
        if (pVVar1[2].field_0.field_3.Type != '\x01') {
          pcVar3 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
          goto LAB_0042ec4d;
        }
      }
      else {
        pVVar1 = param;
        if (param[2].field_0.field_3.Type != '\x01') {
          pcVar3 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_0042ec4d:
          __assert_fail(pcVar3,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x1248,
                        "int AF_AActor_Spawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
        }
      }
      local_40.Y = (double)pVVar1[2].field_0.field_1.a;
      if (numparam < 4) {
        pVVar1 = defaultparam->Array;
        if (pVVar1[3].field_0.field_3.Type != '\x01') {
          pcVar3 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
          goto LAB_0042ec6c;
        }
      }
      else {
        pVVar1 = param;
        if (param[3].field_0.field_3.Type != '\x01') {
          pcVar3 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_0042ec6c:
          __assert_fail(pcVar3,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x1249,
                        "int AF_AActor_Spawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
        }
      }
      local_40.Z = (double)pVVar1[3].field_0.field_1.a;
      if (numparam < 5) {
        param = defaultparam->Array;
        if (param[4].field_0.field_3.Type == '\0') goto LAB_0042eba0;
        pcVar3 = "(defaultparam[paramnum]).Type == REGT_INT";
      }
      else {
        if (param[4].field_0.field_3.Type == '\0') {
LAB_0042eba0:
          iVar4 = 0;
          val = AActor::StaticSpawn(type,&local_40,param[4].field_0.i,false);
          if (0 < numret) {
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                            ,0x124b,
                            "int AF_AActor_Spawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            iVar4 = 1;
            VMReturn::SetPointer(ret,val,1);
          }
          return iVar4;
        }
        pcVar3 = "(param[paramnum]).Type == REGT_INT";
      }
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x124a,
                    "int AF_AActor_Spawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar3 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_0042ecaa:
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x1246,"int AF_AActor_Spawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, Spawn)
{
	PARAM_PROLOGUE;
	PARAM_CLASS_NOT_NULL(type, AActor);
	PARAM_FLOAT_DEF(x);
	PARAM_FLOAT_DEF(y);
	PARAM_FLOAT_DEF(z);
	PARAM_INT_DEF(flags);
	ACTION_RETURN_OBJECT(AActor::StaticSpawn(type, DVector3(x, y, z), replace_t(flags)));
}